

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool __thiscall
ON_ModelComponent::SetModelComponentStatus
          (ON_ModelComponent *this,ON_ComponentStatus component_status)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  
  uVar2 = this->m_locked_status;
  if ((uVar2 >> 8 & 1) == 0) {
    bVar3 = ON_ComponentStatus::operator!=(&this->m_component_status,component_status);
    this->m_component_status = component_status;
    pbVar1 = (byte *)((long)&this->m_set_status + 1);
    *pbVar1 = *pbVar1 | 1;
    if (bVar3) {
      this->m_content_version_number = this->m_content_version_number + 1;
    }
  }
  return (uVar2 >> 8 & 1) == 0;
}

Assistant:

bool ON_ModelComponent::SetModelComponentStatus(
  ON_ComponentStatus component_status
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::ComponentStatusAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (m_component_status != component_status);

  m_component_status = component_status;
  m_set_status |= bit;

  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}